

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmArrayIndex(LlvmCompilationContext *ctx,ExprArrayIndex *node)

{
  bool bVar1;
  LLVMValueRef pLVar2;
  LLVMValueRef pLVar3;
  LLVMTypeRef pLVar4;
  LLVMValueRef local_58;
  LLVMValueRef indices [2];
  LLVMValueRef local_40;
  LLVMValueRef indices_1 [1];
  LLVMValueRef start;
  LLVMValueRef index;
  LLVMValueRef value;
  ExprArrayIndex *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar2 = CompileLlvm(ctx,node->value);
  pLVar3 = CompileLlvm(ctx,node->index);
  bVar1 = isType<TypeUnsizedArray>(node->value->type);
  if (bVar1) {
    indices_1[0] = LLVMBuildExtractValue(ctx->builder,pLVar2,0,"arr_ptr");
    local_40 = pLVar3;
    pLVar2 = LLVMBuildGEP(ctx->builder,indices_1[0],&local_40,1,"");
    ctx_local = (LlvmCompilationContext *)CheckType(ctx,&node->super_ExprBase,pLVar2);
  }
  else {
    pLVar4 = LLVMInt32TypeInContext(ctx->context);
    local_58 = LLVMConstInt(pLVar4,0,true);
    indices[0] = pLVar3;
    pLVar2 = LLVMBuildGEP(ctx->builder,pLVar2,&local_58,2,"");
    ctx_local = (LlvmCompilationContext *)CheckType(ctx,&node->super_ExprBase,pLVar2);
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef CompileLlvmArrayIndex(LlvmCompilationContext &ctx, ExprArrayIndex *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);
	LLVMValueRef index = CompileLlvm(ctx, node->index);

	if(isType<TypeUnsizedArray>(node->value->type))
	{
		// TODO: bounds checking
		LLVMValueRef start = LLVMBuildExtractValue(ctx.builder, value, 0, "arr_ptr");

		LLVMValueRef indices[] = { index };

		return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, start, indices, 1, ""));
	}

	// TODO: bounds checking
	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), index };

	return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, value, indices, 2, ""));
}